

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzw.cc
# Opt level: O1

int main(int argc,char **argv)

{
  char *filename;
  int iVar1;
  FILE *__stream;
  FILE *f;
  void *__buf;
  ostream *poVar2;
  FILE *__n;
  bool bVar3;
  Pl_StdioFile out;
  Pl_LZWDecoder decode;
  uchar buf [10000];
  Pl_StdioFile local_27e0;
  Pl_LZWDecoder local_27a8;
  undefined1 local_2738 [10008];
  
  bVar3 = true;
  if (argc == 4) {
    iVar1 = strcmp(argv[3],"--no-early-code-change");
    bVar3 = iVar1 != 0;
  }
  if (2 < argc) {
    filename = argv[2];
    __stream = (FILE *)QUtil::safe_fopen(argv[1],"rb");
    f = QUtil::safe_fopen(filename,"wb");
    Pl_StdioFile::Pl_StdioFile(&local_27e0,"output",f);
    Pl_LZWDecoder::Pl_LZWDecoder(&local_27a8,"decode",&local_27e0.super_Pipeline,bVar3);
    bVar3 = false;
    do {
      __n = __stream;
      __buf = (void *)fread(local_2738,1,10000,__stream);
      if (__buf == (void *)0x0) {
        bVar3 = true;
      }
      else {
        Pl_LZWDecoder::write(&local_27a8,(int)local_2738,__buf,(size_t)__n);
      }
    } while (!bVar3);
    Pl_LZWDecoder::finish(&local_27a8);
    Pl_LZWDecoder::~Pl_LZWDecoder(&local_27a8);
    Pl_StdioFile::~Pl_StdioFile(&local_27e0);
    return 0;
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,
                           "Usage: lzw infile outfile [ --no-early-code-change ]");
  std::endl<char,std::char_traits<char>>(poVar2);
  exit(2);
}

Assistant:

int
main(int argc, char* argv[])
{
    bool early_code_change = true;
    if ((argc == 4) && (strcmp(argv[3], "--no-early-code-change") == 0)) {
        early_code_change = false;
    }

    if (argc < 3) {
        std::cerr << "Usage: lzw infile outfile [ --no-early-code-change ]" << std::endl;
        exit(2);
    }

    try {
        char* infilename = argv[1];
        char* outfilename = argv[2];

        FILE* infile = QUtil::safe_fopen(infilename, "rb");
        FILE* outfile = QUtil::safe_fopen(outfilename, "wb");

        Pl_StdioFile out("output", outfile);
        Pl_LZWDecoder decode("decode", &out, early_code_change);

        unsigned char buf[10000];
        bool done = false;
        while (!done) {
            size_t len = fread(buf, 1, sizeof(buf), infile);
            if (len <= 0) {
                done = true;
            } else {
                decode.write(buf, len);
            }
        }
        decode.finish();
    } catch (std::exception& e) {
        std::cerr << e.what() << std::endl;
        exit(2);
    }

    return 0;
}